

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

lua_Integer luaL_checkinteger(lua_State *L,int idx)

{
  ulong uVar1;
  int iVar2;
  TValue *o;
  ulong uVar3;
  TValue tmp;
  TValue local_20;
  
  o = index2adr(L,idx);
  uVar1 = o->it64;
  uVar3 = (long)uVar1 >> 0x2f;
  if (uVar3 < 0xfffffffffffffff2) {
LAB_0011bca3:
    return (long)o->n;
  }
  if (uVar3 == 0xfffffffffffffffb) {
    o = &local_20;
    iVar2 = lj_strscan_num((GCstr *)(uVar1 & 0x7fffffffffff),o);
    if (iVar2 != 0) goto LAB_0011bca3;
  }
  lj_err_argt(L,idx,3);
}

Assistant:

LUALIB_API lua_Integer luaL_checkinteger(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  lua_Number n;
  if (LJ_LIKELY(tvisint(o))) {
    return intV(o);
  } else if (LJ_LIKELY(tvisnum(o))) {
    n = numV(o);
  } else {
    if (!(tvisstr(o) && lj_strscan_number(strV(o), &tmp)))
      lj_err_argt(L, idx, LUA_TNUMBER);
    if (tvisint(&tmp))
      return (lua_Integer)intV(&tmp);
    n = numV(&tmp);
  }
#if LJ_64
  return (lua_Integer)n;
#else
  return lj_num2int(n);
#endif
}